

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

bool __thiscall tinyusdz::Stage::add_root_prim(Stage *this,Prim *prim,bool rename_prim_name)

{
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Path *pPVar1;
  pointer pPVar2;
  bool bVar3;
  size_type sVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined7 in_register_00000011;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  string unique_name;
  string elementName;
  ostringstream ss_e;
  allocator local_235;
  undefined4 local_234;
  Path *local_230;
  string local_228;
  key_type local_208;
  string local_1e8;
  allocator local_1c8 [32];
  Path local_1a8;
  
  pPVar1 = &prim->_elementPath;
  ::std::__cxx11::string::string((string *)&local_208,(string *)pPVar1);
  if (local_208._M_string_length == 0) {
    if (rename_prim_name) {
      ::std::__cxx11::string::assign((char *)&local_208);
      bVar3 = SetPrimElementName(&prim->_data,&local_208);
      if (bVar3) {
        ::std::__cxx11::string::string((string *)&local_228,"",(allocator *)&local_1e8);
        Path::Path(&local_1a8,&local_208,&local_228);
        Path::operator=(pPVar1,&local_1a8);
        Path::~Path(&local_1a8);
        ::std::__cxx11::string::_M_dispose();
        goto LAB_00267c4a;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"add_root_prim");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x27d);
      ::std::operator<<(poVar5," ");
      pcVar7 = "Internal error. cannot modify Prim\'s elementName";
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"add_root_prim");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x281);
      ::std::operator<<(poVar5," ");
      pcVar7 = "Prim has empty elementName.";
    }
LAB_0026815a:
    poVar5 = ::std::operator<<((ostream *)&local_1a8,pcVar7);
    ::std::operator<<(poVar5,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
LAB_002681a3:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  }
  else {
LAB_00267c4a:
    local_234 = (undefined4)CONCAT71(in_register_00000011,rename_prim_name);
    this_00 = &this->_root_node_nameSet;
    local_230 = pPVar1;
    if (((long)(this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(this->_root_nodes).
              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x350 !=
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this_00->_M_t);
      lVar8 = 0x1a0;
      for (uVar6 = 0;
          pPVar2 = (this->_root_nodes).
                   super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar6 < (ulong)(((long)(this->_root_nodes).
                                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x350)
          ; uVar6 = uVar6 + 1) {
        if (*(long *)((long)&(pPVar2->_abs_path)._prim_part + lVar8 + 8) == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"add_root_prim");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x28a);
          ::std::operator<<(poVar5," ");
          pcVar7 = "Internal error: Existing root Prim\'s elementName is empty.";
          goto LAB_0026815a;
        }
        sVar4 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this_00->_M_t,(key_type *)((long)&(pPVar2->_abs_path)._prim_part + lVar8));
        if (sVar4 != 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"add_root_prim");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x28e);
          ::std::operator<<(poVar5," ");
          pcVar7 = "Internal error: Stage contains root Prim with same elementName.";
          goto LAB_0026815a;
        }
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_equal<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((this->_root_nodes).
                             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_abs_path)._prim_part +
                   lVar8));
        lVar8 = lVar8 + 0x350;
      }
    }
    sVar4 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this_00->_M_t,&local_208);
    if (sVar4 == 0) {
LAB_00267d43:
      ::std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_equal<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,&local_208);
      ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                (&this->_root_nodes,prim);
      this->_dirty = true;
      bVar3 = true;
      goto LAB_002681aa;
    }
    if ((char)local_234 == '\0') {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"add_root_prim");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x2a4);
      ::std::operator<<(poVar5," ");
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"Prim name(elementName) {} already exists in children.\n",
                 local_1c8);
      fmt::format<std::__cxx11::string>
                ((string *)&local_228,(fmt *)&local_1e8,&local_230->_prim_part,in_RCX);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,(string *)&local_228);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)&this->_err);
      ::std::__cxx11::string::_M_dispose();
      goto LAB_002681a3;
    }
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    local_228._M_string_length = 0;
    local_228.field_2._M_local_buf[0] = '\0';
    bVar3 = makeUniqueName(this_00,&local_208,&local_228);
    pPVar1 = local_230;
    if (bVar3) {
      ::std::__cxx11::string::_M_assign((string *)&local_208);
      bVar3 = SetPrimElementName(&prim->_data,&local_208);
      if (bVar3) {
        ::std::__cxx11::string::string((string *)&local_1e8,"",local_1c8);
        Path::Path(&local_1a8,&local_208,&local_1e8);
        Path::operator=(pPVar1,&local_1a8);
        Path::~Path(&local_1a8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        goto LAB_00267d43;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"add_root_prim");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x2a0);
      ::std::operator<<(poVar5," ");
      poVar5 = ::std::operator<<((ostream *)&local_1a8,
                                 "Internal error. cannot modify Prim\'s elementName.");
      ::std::operator<<(poVar5,"\n");
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"add_root_prim");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x299);
      ::std::operator<<(poVar5," ");
      ::std::__cxx11::string::string
                ((string *)local_1c8,"Internal error. cannot assign unique name for `{}`.\n",
                 &local_235);
      fmt::format<std::__cxx11::string>
                ((string *)&local_1e8,(fmt *)local_1c8,(string *)&local_208,in_RCX);
      poVar5 = ::std::operator<<((ostream *)&local_1a8,(string *)&local_1e8);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    ::std::__cxx11::string::_M_dispose();
  }
  bVar3 = false;
LAB_002681aa:
  ::std::__cxx11::string::_M_dispose();
  return bVar3;
}

Assistant:

bool Stage::add_root_prim(Prim &&prim, bool rename_prim_name) {

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif


  std::string elementName = prim.element_name();

  if (elementName.empty()) {
    if (rename_prim_name) {

      // assign default name `default`
      elementName = "default";

      if (!SetPrimElementName(prim.get_data(), elementName)) {
        PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName");
      }
      prim.element_path() = Path(elementName, /* prop_part */"");
    } else {
      PUSH_ERROR_AND_RETURN("Prim has empty elementName.");
    }
  }

  if (_root_nodes.size() != _root_node_nameSet.size()) {
    // Rebuild nameSet
    _root_node_nameSet.clear();
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      if (_root_nodes[i].element_name().empty()) {
        PUSH_ERROR_AND_RETURN("Internal error: Existing root Prim's elementName is empty.");
      }

      if (_root_node_nameSet.count(_root_nodes[i].element_name())) {
        PUSH_ERROR_AND_RETURN("Internal error: Stage contains root Prim with same elementName.");
      }

      _root_node_nameSet.insert(_root_nodes[i].element_name());
    }
  }

  if (_root_node_nameSet.count(elementName)) {
    if (rename_prim_name) {
      std::string unique_name;
      if (!makeUniqueName(_root_node_nameSet, elementName, &unique_name)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Internal error. cannot assign unique name for `{}`.\n", elementName));
      }

      elementName = unique_name;

      // Need to modify both Prim::data::name and Prim::elementPath
      if (!SetPrimElementName(prim.get_data(), elementName)) {
        PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
      }
      prim.element_path() = Path(elementName, /* prop_part */"");
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format("Prim name(elementName) {} already exists in children.\n", prim.element_name()));
    }
  }


  _root_node_nameSet.insert(elementName);
  _root_nodes.emplace_back(std::move(prim));

  _dirty = true;

  return true;


}